

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_move_16_frs_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  if (m68ki_cpu.s_flag != 0 || m68ki_cpu.cpu_type == 1) {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar3 = pmmu_translate_addr(uVar3);
    }
    uVar1 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
    uVar3 = (uint)(short)uVar1;
    uVar2 = m68ki_cpu.x_flag >> 4;
    uVar4 = m68ki_cpu.n_flag >> 4;
    bVar7 = m68ki_cpu.not_z_flag == 0;
    uVar5 = m68ki_cpu.v_flag >> 6;
    uVar6 = m68ki_cpu.c_flag >> 8;
    uVar1 = m68ki_cpu.s_flag << 0xb | m68ki_cpu.t1_flag | m68ki_cpu.t0_flag |
            m68ki_cpu.m_flag << 0xb | m68ki_cpu.int_mask;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar3 = pmmu_translate_addr(uVar3);
    }
    m68k_write_memory_16
              (uVar3 & m68ki_cpu.address_mask,
               uVar4 & 8 | uVar2 & 0x10 | (uint)bVar7 << 2 | uVar5 & 2 | uVar6 & 1 | uVar1);
    return;
  }
  m68ki_exception_privilege_violation();
  return;
}

Assistant:

static void m68k_op_move_16_frs_aw(void)
{
	if(CPU_TYPE_IS_000(CPU_TYPE) || FLAG_S)	/* NS990408 */
	{
		uint ea = EA_AW_16();
		m68ki_write_16(ea, m68ki_get_sr());
		return;
	}
	m68ki_exception_privilege_violation();
}